

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O2

void __thiscall Diligent::GLContextState::SetCullMode(GLContextState *this,CULL_MODE CullMode)

{
  GLenum err;
  string msg;
  uint local_4c;
  string local_48;
  
  if ((this->m_RSState).CullMode == CullMode) {
    return;
  }
  if (CullMode == CULL_MODE_NONE) {
    glDisable();
    local_4c = glGetError();
    if (local_4c == 0) goto LAB_0015b23b;
    LogError<false,char[31],char[17],unsigned_int>
              (false,"SetCullMode",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x264,(char (*) [31])"Failed to disable face culling",
               (char (*) [17])"\nGL Error Code: ",&local_4c);
    FormatString<char[6]>(&local_48,(char (*) [6])0x2b552e);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"SetCullMode",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x264);
  }
  else {
    if ((CullMode & ~CULL_MODE_NONE) != CULL_MODE_FRONT) {
      FormatString<char[21]>(&local_48,(char (*) [21])"Unexpected cull mode");
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"SetCullMode",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x268);
      std::__cxx11::string::~string((string *)&local_48);
    }
    glEnable();
    local_4c = glGetError();
    if (local_4c != 0) {
      LogError<false,char[30],char[17],unsigned_int>
                (false,"SetCullMode",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x26a,(char (*) [30])"Failed to enable face culling",
                 (char (*) [17])"\nGL Error Code: ",&local_4c);
      FormatString<char[6]>(&local_48,(char (*) [6])0x2b552e);
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"SetCullMode",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x26a);
      std::__cxx11::string::~string((string *)&local_48);
    }
    glCullFace();
    local_4c = glGetError();
    if (local_4c == 0) goto LAB_0015b23b;
    LogError<false,char[24],char[17],unsigned_int>
              (false,"SetCullMode",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x26d,(char (*) [24])"Failed to set cull face",(char (*) [17])"\nGL Error Code: ",
               &local_4c);
    FormatString<char[6]>(&local_48,(char (*) [6])0x2b552e);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"SetCullMode",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x26d);
  }
  std::__cxx11::string::~string((string *)&local_48);
LAB_0015b23b:
  (this->m_RSState).CullMode = CullMode;
  return;
}

Assistant:

void GLContextState::SetCullMode(CULL_MODE CullMode)
{
    if (m_RSState.CullMode != CullMode)
    {
        if (CullMode == CULL_MODE_NONE)
        {
            glDisable(GL_CULL_FACE);
            DEV_CHECK_GL_ERROR("Failed to disable face culling");
        }
        else
        {
            VERIFY(CullMode == CULL_MODE_FRONT || CullMode == CULL_MODE_BACK, "Unexpected cull mode");
            glEnable(GL_CULL_FACE);
            DEV_CHECK_GL_ERROR("Failed to enable face culling");
            GLenum CullFace = CullMode == CULL_MODE_BACK ? GL_BACK : GL_FRONT;
            glCullFace(CullFace);
            DEV_CHECK_GL_ERROR("Failed to set cull face");
        }

        m_RSState.CullMode = CullMode;
    }
}